

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall
features::Sift::orientation_assignment
          (Sift *this,Keypoint *kp,Octave *octave,
          vector<float,_std::allocator<float>_> *orientations)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  ImageBase *pIVar4;
  element_type *peVar5;
  float *pfVar6;
  int *piVar7;
  float fVar8;
  float fVar9;
  float local_190;
  float local_18c;
  float o;
  float x;
  float h2;
  float h1;
  float h0;
  int i_1;
  float maxh;
  float current;
  int j;
  float prev;
  float first;
  int i;
  int local_158;
  float local_154;
  int bin;
  float local_14c;
  float weight;
  float go;
  float gm;
  float dist;
  int dx;
  int yoff;
  int dy;
  float maxdist;
  float dyf;
  float dxf;
  int center;
  undefined4 local_11c;
  int win;
  float sigma_factor;
  int height;
  int local_104;
  undefined1 local_100 [4];
  int width;
  ConstPtr ori;
  ConstPtr grad;
  float sigma;
  int is;
  int iy;
  int ix;
  float fStack_c4;
  float hist [36];
  float nbinsf;
  int nbins;
  vector<float,_std::allocator<float>_> *orientations_local;
  Octave *octave_local;
  Keypoint *kp_local;
  Sift *this_local;
  
  iy = 0;
  std::fill<float*,float>((float *)&ix,hist + 0x22,(float *)&iy);
  iVar1 = (int)(kp->x + 0.5);
  iVar2 = (int)(kp->y + 0.5);
  fVar8 = math::round<float>(&kp->sample);
  fVar9 = keypoint_relative_scale(this,kp);
  pvVar3 = std::
           vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ::operator[](&octave->grad,(long)((int)fVar8 + 1));
  this_00 = &ori.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
            ((shared_ptr<core::Image<float>const> *)this_00,pvVar3);
  pvVar3 = std::
           vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ::operator[](&octave->ori,(long)((int)fVar8 + 1));
  std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
            ((shared_ptr<core::Image<float>const> *)local_100,pvVar3);
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  local_104 = core::ImageBase::width(pIVar4);
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&ori.
                          super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  win = core::ImageBase::height(pIVar4);
  local_11c = 0x3fc00000;
  center = (int)(fVar9 * 1.5 * 3.0);
  if ((((iVar1 < center) || (local_104 <= iVar1 + center)) || (iVar2 < center)) ||
     (win <= iVar2 + center)) {
    dxf = 1.4013e-45;
  }
  else {
    dyf = (float)(iVar2 * local_104 + iVar1);
    maxdist = kp->x - (float)iVar1;
    dy = (int)(kp->y - (float)iVar2);
    yoff = (int)((float)(center * center) + 0.5);
    for (dx = -center; dx <= center; dx = dx + 1) {
      dist = (float)(dx * local_104);
      for (gm = (float)-center; (int)gm <= center; gm = (float)((int)gm + 1)) {
        go = ((float)(int)gm - maxdist) * ((float)(int)gm - maxdist) +
             ((float)dx - (float)dy) * ((float)dx - (float)dy);
        if (go <= (float)yoff) {
          peVar5 = std::
                   __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&ori.
                                    super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          pfVar6 = core::Image<float>::at(peVar5,(int)dyf + (int)dist + (int)gm);
          weight = *pfVar6;
          peVar5 = std::
                   __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_100);
          pfVar6 = core::Image<float>::at(peVar5,(int)dyf + (int)dist + (int)gm);
          local_14c = *pfVar6;
          local_154 = fVar9 * 1.5;
          bin = (int)math::gaussian_xx<float>(&go,&local_154);
          local_158 = (int)((local_14c * 36.0) / 6.2831855);
          i = 0;
          first = 4.90454e-44;
          piVar7 = math::clamp<int>(&local_158,&i,(int *)&first);
          local_158 = *piVar7;
          (&ix)[local_158] = (int)(weight * (float)bin + (float)(&ix)[local_158]);
        }
      }
    }
    for (prev = 0.0; iVar1 = ix, (int)prev < 6; prev = (float)((int)prev + 1)) {
      j = ix;
      current = hist[0x21];
      for (maxh = 0.0; (int)maxh < 0x23; maxh = (float)((int)maxh + 1)) {
        i_1 = (&ix)[(int)maxh];
        (&ix)[(int)maxh] = (int)((current + (float)i_1 + (float)(&ix)[(int)maxh + 1]) / 3.0);
        current = (float)i_1;
      }
      hist[0x21] = (current + hist[0x21] + (float)iVar1) / 3.0;
    }
    pfVar6 = std::max_element<float*>((float *)&ix,hist + 0x22);
    h0 = *pfVar6;
    for (h1 = 0.0; (int)h1 < 0x24; h1 = (float)((int)h1 + 1)) {
      h2 = (float)(&ix)[((int)h1 + 0x23) % 0x24];
      x = (float)(&ix)[(int)h1];
      o = (float)(&ix)[((int)h1 + 1) % 0x24];
      if (((h0 * 0.8 < x) && (h2 < x)) && (o < x)) {
        local_18c = ((o - h2) * -0.5) / ((h2 - (x + x)) + o);
        local_190 = ((local_18c + (float)(int)h1 + 0.5) * 6.2831855) / 36.0;
        std::vector<float,_std::allocator<float>_>::push_back(orientations,&local_190);
      }
    }
    dxf = 0.0;
  }
  std::shared_ptr<const_core::Image<float>_>::~shared_ptr
            ((shared_ptr<const_core::Image<float>_> *)local_100);
  std::shared_ptr<const_core::Image<float>_>::~shared_ptr
            ((shared_ptr<const_core::Image<float>_> *)
             &ori.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
Sift::orientation_assignment (Keypoint const& kp,
    Octave const* octave, std::vector<float>& orientations)
{
    int const nbins = 36;
    float const nbinsf = static_cast<float>(nbins);

    /* Prepare 36-bin histogram. */
    float hist[nbins];
    std::fill(hist, hist + nbins, 0.0f);

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /*
     * Compute window size 'win', the full window has  2 * win + 1  pixel.
     * The factor 3 makes the window large enough such that the gaussian
     * has very little weight beyond the window. The value 1.5 is from
     * the SIFT paper. If the window goes beyond the image boundaries,
     * the keypoint is discarded.
     */
    float const sigma_factor = 1.5f;
    int win = static_cast<int>(sigma * sigma_factor * 3.0f);
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return;

    /* Center of keypoint index. */
    int center = iy * width + ix;
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const maxdist = static_cast<float>(win*win) + 0.5f;

    /* Populate histogram over window, intersected with (1,1), (w-2,h-2). */
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Limit to circular window (centered at accurate keypoint). */
            float const dist = MATH_POW2(dx-dxf) + MATH_POW2(dy-dyf);
            if (dist > maxdist)
                continue;

            float gm = grad->at(center + yoff + dx); // gradient magnitude
            float go = ori->at(center + yoff + dx); // gradient orientation
            float weight = math::gaussian_xx(dist, sigma * sigma_factor);
            int bin = static_cast<int>(nbinsf * go / (2.0f * MATH_PI));
            bin = math::clamp(bin, 0, nbins - 1);
            hist[bin] += gm * weight;
        }
    }

    /* Smooth histogram. */
    for (int i = 0; i < 6; ++i)
    {
        float first = hist[0];
        float prev = hist[nbins - 1];
        for (int j = 0; j < nbins - 1; ++j)
        {
            float current = hist[j];
            hist[j] = (prev + current + hist[j + 1]) / 3.0f;
            prev = current;
        }
        hist[nbins - 1] = (prev + hist[nbins - 1] + first) / 3.0f;
    }

    /* Find maximum element. */
    float maxh = *std::max_element(hist, hist + nbins);

    /* Find peaks within 80% of max element. */
    for (int i = 0; i < nbins; ++i)
    {
        float h0 = hist[(i + nbins - 1) % nbins];
        float h1 = hist[i];
        float h2 = hist[(i + 1) % nbins];

        /* These peaks must be a local maximum! */
        if (h1 <= 0.8f * maxh || h1 <= h0 || h1 <= h2)
            continue;

        /*
         * Quadratic interpolation to find accurate maximum.
         * f(x) = ax^2 + bx + c, f(-1) = h0, f(0) = h1, f(1) = h2
         * --> a = 1/2 (h0 - 2h1 + h2), b = 1/2 (h2 - h0), c = h1.
         * x = f'(x) = 2ax + b = 0 --> x = -1/2 * (h2 - h0) / (h0 - 2h1 + h2)
         */
        float x = -0.5f * (h2 - h0) / (h0 - 2.0f * h1 + h2);
        float o =  2.0f * MATH_PI * (x + (float)i + 0.5f) / nbinsf;
        orientations.push_back(o);
    }
}